

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

EndOfGameType __thiscall hanabi_learning_env::HanabiState::EndOfGameStatus(HanabiState *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  HanabiGame *pHVar4;
  HanabiState *in_RDI;
  EndOfGameType local_4;
  
  iVar1 = LifeTokens(in_RDI);
  if (iVar1 < 1) {
    local_4 = kOutOfLifeTokens;
  }
  else {
    iVar1 = Score(in_RDI);
    pHVar4 = ParentGame(in_RDI);
    iVar2 = HanabiGame::NumColors(pHVar4);
    pHVar4 = ParentGame(in_RDI);
    iVar3 = HanabiGame::NumRanks(pHVar4);
    if (iVar1 < iVar2 * iVar3) {
      if (in_RDI->turns_to_play_ < 1) {
        local_4 = kOutOfCards;
      }
      else {
        local_4 = kNotFinished;
      }
    }
    else {
      local_4 = kCompletedFireworks;
    }
  }
  return local_4;
}

Assistant:

HanabiState::EndOfGameType HanabiState::EndOfGameStatus() const {
  if (LifeTokens() < 1) {
    return kOutOfLifeTokens;
  }
  if (Score() >= ParentGame()->NumColors() * ParentGame()->NumRanks()) {
    return kCompletedFireworks;
  }
  if (turns_to_play_ <= 0) {
    return kOutOfCards;
  }
  return kNotFinished;
}